

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void ImGui::PopColumnsBackground(void)

{
  ImGuiColumns *pIVar1;
  ImDrawList *draw_list;
  
  pIVar1 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (pIVar1->Count == 1) {
    return;
  }
  draw_list = GImGui->CurrentWindow->DrawList;
  ImDrawListSplitter::SetCurrentChannel(&draw_list->_Splitter,draw_list,pIVar1->Current + 1);
  PopClipRect();
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindowRead()      { ImGuiContext& g = *GImGui; return g.CurrentWindow; }